

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O3

ArgInfo * __thiscall
SoapySDR::Device::getSettingInfo(ArgInfo *__return_storage_ptr__,Device *this,string *key)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  __it;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  __it_00;
  ArgInfoList allArgInfos;
  vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> local_48;
  
  (*this->_vptr_Device[100])(&local_48);
  lVar2 = (long)local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (lVar2 >> 4) * -0x1111111111111111 >> 2;
  __it_00._M_current =
       local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (0 < lVar3) {
    lVar2 = lVar3 + 1;
    __it._M_current =
         local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl.
         super__Vector_impl_data._M_start;
    do {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                          *)key,__it);
      __it_00._M_current = __it._M_current;
      if (bVar1) goto LAB_0011ca59;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                          *)key,__it._M_current + 1);
      __it_00._M_current = __it._M_current + 1;
      if (bVar1) goto LAB_0011ca59;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                          *)key,__it._M_current + 2);
      __it_00._M_current = __it._M_current + 2;
      if (bVar1) goto LAB_0011ca59;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                          *)key,__it._M_current + 3);
      __it_00._M_current = __it._M_current + 3;
      if (bVar1) goto LAB_0011ca59;
      __it._M_current = __it._M_current + 4;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
    lVar2 = (long)local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_48.
                   super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl
                   .super__Vector_impl_data._M_start + lVar3 * 4);
    __it_00._M_current =
         local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl.
         super__Vector_impl_data._M_start + lVar3 * 4;
  }
  lVar2 = (lVar2 >> 4) * -0x1111111111111111;
  if (lVar2 == 1) {
LAB_0011ca3b:
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                        *)key,__it_00);
    if (!bVar1) {
      __it_00._M_current =
           local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
    }
LAB_0011ca59:
    if (__it_00._M_current !=
        local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ArgInfo::ArgInfo(__return_storage_ptr__,__it_00._M_current);
      goto LAB_0011ca73;
    }
  }
  else {
    if (lVar2 == 2) {
LAB_0011ca25:
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                          *)key,__it_00);
      if (!bVar1) {
        __it_00._M_current = __it_00._M_current + 1;
        goto LAB_0011ca3b;
      }
      goto LAB_0011ca59;
    }
    if (lVar2 == 3) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                          *)key,__it_00);
      if (!bVar1) {
        __it_00._M_current = __it_00._M_current + 1;
        goto LAB_0011ca25;
      }
      goto LAB_0011ca59;
    }
  }
  ArgInfo::ArgInfo(__return_storage_ptr__);
LAB_0011ca73:
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

SoapySDR::ArgInfo SoapySDR::Device::getSettingInfo(const std::string &key) const
{
    const auto allArgInfos = this->getSettingInfo();
    auto argInfoIter = std::find_if(
        allArgInfos.begin(),
        allArgInfos.end(),
        [&key](const SoapySDR::ArgInfo &argInfo)
        {
            return (argInfo.key == key);
        });

    return (argInfoIter != allArgInfos.end()) ? (*argInfoIter) : SoapySDR::ArgInfo();
}